

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

int __thiscall cmComputeLinkDepends::ComputeComponentCount(cmComputeLinkDepends *this,NodeList *nl)

{
  cmTarget *this_00;
  LinkInterface *pLVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = 2;
  for (piVar3 = (nl->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar3 != (nl->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar3 = piVar3 + 1) {
    this_00 = (this->EntryList).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_start[*piVar3].Target;
    if (this_00 != (cmTarget *)0x0) {
      pLVar1 = cmTarget::GetLinkInterface(this_00,&this->Config,this->Target);
      if (pLVar1 != (LinkInterface *)0x0) {
        if (iVar2 < pLVar1->Multiplicity) {
          iVar2 = pLVar1->Multiplicity;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int cmComputeLinkDepends::ComputeComponentCount(NodeList const& nl)
{
  int count = 2;
  for(NodeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni)
    {
    if(cmTarget const* target = this->EntryList[*ni].Target)
      {
      if(cmTarget::LinkInterface const* iface =
         target->GetLinkInterface(this->Config, this->Target))
        {
        if(iface->Multiplicity > count)
          {
          count = iface->Multiplicity;
          }
        }
      }
    }
  return count;
}